

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

size_t coda_revnspn(char *s,char *n,size_t len)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  char cVar5;
  char *pcVar6;
  char cVar7;
  
  lVar1 = len - 1;
  lVar4 = lVar1;
  if (0 < (long)len) {
    cVar2 = *n;
    cVar5 = cVar2;
    do {
      if (cVar5 == '\0') goto LAB_001054e8;
      if (cVar2 != '\0') {
        cVar5 = s[lVar4];
        pcVar6 = n + 1;
        cVar7 = cVar2;
        do {
          if (cVar5 == cVar7) goto LAB_001054d5;
          cVar7 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        } while (cVar7 != '\0');
      }
      cVar5 = '\0';
LAB_001054d5:
      bVar3 = 0 < lVar4;
      lVar4 = lVar4 + -1;
    } while (bVar3);
    lVar4 = -1;
  }
LAB_001054e8:
  return lVar1 - lVar4;
}

Assistant:

size_t coda_revnspn(const char *s, const char *n, size_t len)
{
	const char *b = s - 1;
	const char *p = s - 1 + len;
	const char *x = n;

	for (; p > b && *x; --p)
	{
		for (x = n; *x; ++x)
		{
			if (*p == *x) break;
		}
	}

	return s - 1 + len - p;
}